

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReader.cpp
# Opt level: O1

void __thiscall MILBlob::Blob::StorageReader::StorageReader(StorageReader *this,string *filename)

{
  size_type sVar1;
  _Head_base<0UL,_MILBlob::Blob::StorageReader::Impl_*,_false> _Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_type *local_30;
  size_type local_20;
  long lStack_18;
  
  _Var2._M_head_impl = (Impl *)operator_new(0x30);
  local_30 = (size_type *)(filename->_M_dataplus)._M_p;
  paVar3 = &filename->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30 == paVar3) {
    local_20 = paVar3->_M_allocated_capacity;
    lStack_18 = *(long *)((long)&filename->field_2 + 8);
    local_30 = &local_20;
  }
  else {
    local_20 = paVar3->_M_allocated_capacity;
  }
  sVar1 = filename->_M_string_length;
  (filename->_M_dataplus)._M_p = (pointer)paVar3;
  filename->_M_string_length = 0;
  (filename->field_2)._M_local_buf[0] = '\0';
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)&(_Var2._M_head_impl)->m_filePath + 0x10);
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)&(_Var2._M_head_impl)->m_filePath = paVar3;
  if (local_30 == &local_20) {
    paVar3->_M_allocated_capacity = local_20;
    *(long *)((long)&(_Var2._M_head_impl)->m_filePath + 0x18) = lStack_18;
  }
  else {
    *(size_type **)&(_Var2._M_head_impl)->m_filePath = local_30;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)((long)&(_Var2._M_head_impl)->m_filePath + 0x10))->_M_allocated_capacity = local_20;
  }
  *(size_type *)((long)&(_Var2._M_head_impl)->m_filePath + 8) = sVar1;
  ((_Var2._M_head_impl)->m_loadedFlag)._M_once = 0;
  ((_Var2._M_head_impl)->m_reader)._M_t =
       (__uniq_ptr_data<const_MILBlob::Blob::MMapFileReader,_std::default_delete<const_MILBlob::Blob::MMapFileReader>,_true,_true>
        )0x0;
  (this->m_impl)._M_t.
  super___uniq_ptr_impl<MILBlob::Blob::StorageReader::Impl,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
  ._M_t.
  super__Tuple_impl<0UL,_MILBlob::Blob::StorageReader::Impl_*,_std::default_delete<MILBlob::Blob::StorageReader::Impl>_>
  .super__Head_base<0UL,_MILBlob::Blob::StorageReader::Impl_*,_false>._M_head_impl =
       _Var2._M_head_impl;
  return;
}

Assistant:

StorageReader::StorageReader(std::string filename) : m_impl(std::make_unique<Impl>(std::move(filename))) {}